

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_dense.c
# Opt level: O3

void denseCopy(realtype **a,realtype **b,sunindextype m,sunindextype n)

{
  realtype *prVar1;
  realtype *prVar2;
  ulong uVar3;
  ulong uVar4;
  
  if (0 < n) {
    uVar3 = 0;
    do {
      if (0 < m) {
        prVar1 = a[uVar3];
        prVar2 = b[uVar3];
        uVar4 = 0;
        do {
          prVar2[uVar4] = prVar1[uVar4];
          uVar4 = uVar4 + 1;
        } while ((uint)m != uVar4);
      }
      uVar3 = uVar3 + 1;
    } while (uVar3 != (uint)n);
  }
  return;
}

Assistant:

void SUNDlsMat_denseCopy(realtype **a, realtype **b, sunindextype m, sunindextype n)
{
  sunindextype i, j;
  realtype *a_col_j, *b_col_j;

  for (j=0; j < n; j++) {
    a_col_j = a[j];
    b_col_j = b[j];
    for (i=0; i < m; i++)
      b_col_j[i] = a_col_j[i];
  }

}